

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::IfcCovering(IfcCovering *this)

{
  IfcCovering *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x180,"IfcCovering");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00f88810);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>,
             &PTR_construction_vtable_24__00f88948);
  *(undefined8 *)this = 0xf886e0;
  *(undefined8 *)&this->field_0x180 = 0xf887f8;
  *(undefined8 *)&this->field_0x88 = 0xf88708;
  *(undefined8 *)&this->field_0x98 = 0xf88730;
  *(undefined8 *)&this->field_0xd0 = 0xf88758;
  *(undefined8 *)&this->field_0x100 = 0xf88780;
  *(undefined8 *)&this->field_0x138 = 0xf887a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf887d0;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x10);
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}